

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.h
# Opt level: O2

Literal * wasm::Literal::makeSignedMax(Literal *__return_storage_ptr__,Type type)

{
  BasicType BVar1;
  uintptr_t uStack_20;
  Type local_18;
  Type type_local;
  
  local_18.id = type.id;
  BVar1 = wasm::Type::getBasic(&local_18);
  if (BVar1 == i64) {
    (__return_storage_ptr__->field_0).i64 = 0x7fffffffffffffff;
    uStack_20 = 3;
  }
  else {
    if (BVar1 != i32) {
      handle_unreachable("unexpected type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                         ,0xeb);
    }
    (__return_storage_ptr__->field_0).i32 = 0x7fffffff;
    uStack_20 = 2;
  }
  (__return_storage_ptr__->type).id = uStack_20;
  return __return_storage_ptr__;
}

Assistant:

static Literal makeSignedMax(Type type) {
    switch (type.getBasic()) {
      case Type::i32:
        return Literal(std::numeric_limits<int32_t>::max());
      case Type::i64:
        return Literal(std::numeric_limits<int64_t>::max());
      default:
        WASM_UNREACHABLE("unexpected type");
    }
  }